

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlSchemaTypePtr *ppxVar1;
  uint uVar2;
  xmlSchemaTypeType xVar3;
  xmlSchemaTypePtr type_00;
  xmlGenericErrorFunc p_Var4;
  bool bVar5;
  uint valNeeded;
  xmlParserErrors error;
  int iVar6;
  int iVar7;
  xmlParserErrors xVar8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  xmlChar *pxVar11;
  undefined4 extraout_var;
  byte *pbVar12;
  xmlChar *pxVar13;
  xmlSchemaTypePtr pxVar14;
  byte *pbVar15;
  xmlNodePtr node_00;
  xmlSchemaValPtr *ppxVar16;
  ulong uVar17;
  xmlSchemaPtr schema;
  xmlSchemaValidCtxtPtr vctxt;
  byte *pbVar18;
  char *pcVar19;
  uint displayValue;
  undefined4 in_register_0000008c;
  undefined8 uVar20;
  xmlSchemaValPtr pxVar21;
  xmlSchemaTypeLinkPtr pxVar22;
  unsigned_long length;
  long lVar23;
  byte bVar24;
  byte *local_a0;
  xmlSchemaValPtr val;
  xmlSchemaValPtr *local_80;
  xmlSchemaTypePtr local_78;
  undefined8 local_70;
  xmlSchemaValPtr curVal;
  ulong local_60;
  byte *local_58;
  uint local_4c;
  undefined8 local_48;
  xmlSchemaTypePtr local_40;
  xmlSchemaValPtr local_38;
  
  uVar20 = CONCAT44(in_register_0000008c,fireErrors);
  val = (xmlSchemaValPtr)0x0;
  pcVar19 = (char *)retVal;
  local_78 = type;
  local_70 = uVar20;
  if (retVal == (xmlSchemaValPtr *)0x0) {
    bVar24 = (*(byte *)((long)&type->flags + 2) & 0x20) >> 5 | retVal != (xmlSchemaValPtr *)0x0;
  }
  else {
    bVar24 = 1;
    if (*retVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(*retVal);
      *retVal = (xmlSchemaValPtr)0x0;
    }
  }
  pxVar14 = local_78;
  displayValue = (uint)uVar20;
  valNeeded = (uint)bVar24;
  local_a0 = (byte *)0x1f55e3;
  if (value != (xmlChar *)0x0) {
    local_a0 = value;
  }
  if (((local_78->type == XML_SCHEMA_TYPE_BASIC) && (local_78->builtInType == 0x2e)) ||
     (uVar2 = local_78->flags, (uVar2 >> 8 & 1) != 0)) {
    if (isNormalized == 0) {
      if ((normalize == 0) && ((local_78->flags & 0x10000000) == 0)) {
        pbVar15 = (byte *)0x0;
      }
      else {
        pbVar15 = xmlSchemaNormalizeValue(local_78,local_a0);
        if (pbVar15 != (byte *)0x0) {
          local_a0 = pbVar15;
        }
      }
    }
    else {
      pbVar15 = (byte *)0x0;
    }
    xVar3 = pxVar14->type;
    type_00 = pxVar14;
    while (xVar3 != XML_SCHEMA_TYPE_BASIC) {
      type_00 = type_00->baseType;
      if (type_00 == (xmlSchemaTypePtr)0x0) {
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","could not get the built-in type",
                   (xmlChar *)0x0,(xmlChar *)pcVar19);
        goto LAB_001ac995;
      }
      xVar3 = type_00->type;
    }
    if (actxt->type == 1) {
      if (type_00->builtInType != 0x1c) {
LAB_001ac9a0:
        if (valNeeded == 0) {
          ppxVar16 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar16 = &val;
        }
        xVar8 = xmlSchemaValPredefTypeNodeNoNorm(type_00,local_a0,ppxVar16,node);
        goto LAB_001acc03;
      }
      schema = *(xmlSchemaPtr *)(actxt + 4);
      vctxt = (xmlSchemaValidCtxtPtr)0x0;
      node_00 = node;
LAB_001ac95a:
      pcVar19 = (char *)&val;
      displayValue = valNeeded;
      xVar8 = xmlSchemaValidateNotation
                        (vctxt,schema,node_00,local_a0,(xmlSchemaValPtr *)pcVar19,valNeeded);
    }
    else {
      if (actxt->type != 2) {
        pp_Var9 = __xmlGenericError();
        p_Var4 = *pp_Var9;
        ppvVar10 = __xmlGenericErrorContext();
        (*p_Var4)(*ppvVar10,"Unimplemented block at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
                  ,0x6109);
LAB_001ac995:
        error = XML_ERR_OK;
        bVar5 = false;
        goto LAB_001ace9e;
      }
      if (type_00->builtInType != 0x15) {
        if (type_00->builtInType != 0x1c) goto LAB_001ac9a0;
        schema = (xmlSchemaPtr)actxt[2].dummy;
        node_00 = (xmlNodePtr)0x0;
        vctxt = (xmlSchemaValidCtxtPtr)actxt;
        goto LAB_001ac95a;
      }
      curVal = (xmlSchemaValPtr)0x0;
      iVar6 = xmlValidateQName(local_a0,1);
      if (iVar6 == 0) {
        pbVar12 = xmlSchemaCollapseString(local_a0);
        pbVar18 = pbVar12;
        if (pbVar12 == (byte *)0x0) {
          pbVar18 = local_a0;
        }
        pxVar11 = xmlSplitQName2(pbVar18,(xmlChar **)&curVal);
        (*xmlFree)(pbVar12);
        if (pxVar11 == (xmlChar *)0x0) {
          pxVar11 = xmlStrdup(local_a0);
        }
        pxVar13 = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)actxt,(xmlChar *)curVal);
        if ((curVal == (xmlSchemaValPtr)0x0) || ((*xmlFree)(curVal), pxVar13 != (xmlChar *)0x0)) {
          if (valNeeded == 0) {
            (*xmlFree)(pxVar11);
          }
          else {
            if (pxVar13 == (xmlChar *)0x0) {
              xVar8 = XML_ERR_OK;
              val = xmlSchemaNewQNameValue((xmlChar *)0x0,pxVar11);
              pxVar14 = local_78;
              goto LAB_001acc03;
            }
            pxVar13 = xmlStrdup(pxVar13);
            val = xmlSchemaNewQNameValue(pxVar13,pxVar11);
          }
          xVar8 = XML_ERR_OK;
          pxVar14 = local_78;
        }
        else {
          pxVar14 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
          pcVar19 = "The QName value \'%s\' has no corresponding namespace declaration in scope";
          xVar8 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
          pbVar18 = local_a0;
          xmlSchemaCustomErr4(actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,(xmlNodePtr)0x0,
                              (xmlSchemaBasicItemPtr)pxVar14,
                              "The QName value \'%s\' has no corresponding namespace declaration in scope"
                              ,local_a0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          displayValue = (uint)pbVar18;
          pxVar14 = local_78;
          if (pxVar11 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar11);
            pxVar14 = local_78;
          }
        }
      }
      else {
        xVar8 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
        if (iVar6 == -1) {
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaValidateQName","calling xmlValidateQName()",(xmlChar *)0x0,
                     (xmlChar *)pcVar19);
          xVar8 = ~XML_ERR_OK;
        }
      }
    }
LAB_001acc03:
    if (xVar8 == XML_ERR_OK) {
      error = XML_ERR_OK;
    }
    else {
      if ((int)xVar8 < 0) {
        bVar5 = false;
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","validating against a built-in type",
                   (xmlChar *)0x0,(xmlChar *)pcVar19);
        error = xVar8;
        goto LAB_001ace9e;
      }
      error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((pxVar14->flags & 0x40) == 0);
    }
    if ((xVar8 == XML_ERR_OK) && ((pxVar14->flags & 0x8000000) != 0)) {
      iVar6 = xmlSchemaValidateFacets
                        (actxt,node,pxVar14,type_00->builtInType,local_a0,val,0,(int)local_70);
      bVar5 = true;
      if (iVar6 == 0) {
        error = XML_ERR_OK;
      }
      else if (iVar6 < 0) {
        bVar5 = false;
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","validating facets of atomic simple type",
                   (xmlChar *)0x0,local_a0);
        error = ~XML_ERR_OK;
      }
      else {
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((local_78->flags & 0x40) == 0);
      }
    }
    else {
      bVar5 = true;
      if (((int)local_70 != 0) && (xVar8 != XML_ERR_OK)) {
        xmlSchemaSimpleTypeErr(actxt,error,node,local_a0,local_78,displayValue);
      }
    }
LAB_001ace9e:
    if (bVar5) goto LAB_001acea7;
  }
  else {
    if ((uVar2 & 0x40) == 0) {
      if ((char)uVar2 < '\0') {
        do {
          if (pxVar14->type != XML_SCHEMA_TYPE_SIMPLE) break;
          pxVar22 = pxVar14->memberTypes;
          if (pxVar22 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_001ac9de;
          ppxVar1 = &pxVar14->baseType;
          pxVar14 = *ppxVar1;
        } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
        pxVar22 = (xmlSchemaTypeLinkPtr)0x0;
LAB_001ac9de:
        if (pxVar22 == (xmlSchemaTypeLinkPtr)0x0) {
          error = XML_ERR_OK;
          local_80 = retVal;
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaVCheckCVCSimpleType","union simple type has no member types",
                     (xmlChar *)0x0,(xmlChar *)pcVar19);
LAB_001ace10:
          pbVar15 = (byte *)0x0;
          bVar5 = false;
          retVal = local_80;
          goto LAB_001ace9e;
        }
        local_80 = retVal;
        do {
          ppxVar16 = &val;
          if (valNeeded == 0) {
            ppxVar16 = (xmlSchemaValPtr *)0x0;
          }
          iVar6 = 0;
          error = xmlSchemaVCheckCVCSimpleType(actxt,node,pxVar22->type,local_a0,ppxVar16,0,1,0);
          pxVar14 = local_78;
        } while ((0 < (int)error) && (pxVar22 = pxVar22->next, pxVar22 != (xmlSchemaTypeLinkPtr)0x0)
                );
        if (error == XML_ERR_OK) {
          xVar8 = XML_ERR_OK;
        }
        else {
          xVar8 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
          if ((int)error < 0) {
            xmlSchemaInternalErr2
                      (actxt,"xmlSchemaVCheckCVCSimpleType",
                       "validating members of union simple type",(xmlChar *)0x0,(xmlChar *)ppxVar16)
            ;
            goto LAB_001ace10;
          }
        }
        if (error == XML_ERR_OK) {
          error = XML_ERR_OK;
          xVar8 = XML_ERR_OK;
          if (((uint)local_78->flags >> 0x1b & 1) == 0) goto LAB_001ace61;
          if (isNormalized == 0) {
            if ((local_78->flags & 0x10000000U) == 0 && normalize == 0) {
              pbVar15 = (byte *)0x0;
            }
            else {
              pbVar15 = xmlSchemaNormalizeValue(pxVar22->type,local_a0);
              if (pbVar15 != (byte *)0x0) {
                local_a0 = pbVar15;
              }
            }
          }
          else {
            pbVar15 = (byte *)0x0;
          }
          retVal = local_80;
          pbVar18 = local_a0;
          pxVar21 = val;
          xVar8 = xmlSchemaValidateFacets
                            (actxt,node,pxVar14,XML_SCHEMAS_UNKNOWN,local_a0,val,0,(int)local_70);
          iVar6 = (int)pxVar21;
          if ((xVar8 != XML_ERR_OK) &&
             (error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3, (int)xVar8 < 0)) {
            bVar5 = false;
            xmlSchemaInternalErr2
                      (actxt,"xmlSchemaVCheckCVCSimpleType","validating facets of union simple type"
                       ,(xmlChar *)0x0,pbVar18);
            error = xVar8;
            goto LAB_001ace9e;
          }
        }
        else {
LAB_001ace61:
          error = xVar8;
          pbVar15 = (byte *)0x0;
          retVal = local_80;
        }
        bVar5 = true;
        if (error != XML_ERR_OK && (int)local_70 != 0) {
          xmlSchemaSimpleTypeErr(actxt,error,node,local_a0,local_78,iVar6);
        }
        goto LAB_001ace9e;
      }
      error = XML_ERR_OK;
      pbVar15 = (byte *)0x0;
      goto LAB_001acea7;
    }
    curVal = (xmlSchemaValPtr)0x0;
    if (isNormalized == 0) {
      if ((uVar2 & 0x10000000) == 0 && normalize == 0) {
        local_48 = 1;
        goto LAB_001ac910;
      }
      local_80 = retVal;
      local_58 = xmlSchemaNormalizeValue(local_78,local_a0);
      if (local_58 != (byte *)0x0) {
        local_a0 = local_58;
      }
      local_48 = 0;
    }
    else {
      local_48 = 0;
LAB_001ac910:
      local_58 = (byte *)0x0;
      local_80 = retVal;
    }
    local_40 = pxVar14->subtypes;
    length = 0;
    local_38 = (xmlSchemaValPtr)0x0;
    pbVar15 = local_a0;
    do {
      while( true ) {
        iVar6 = (int)uVar20;
        if ((0x20 < (ulong)*pbVar15) || ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))
        break;
        pbVar15 = pbVar15 + 1;
      }
      lVar23 = 0;
      while ((0x20 < (ulong)pbVar15[lVar23] ||
             ((0x100002601U >> ((ulong)pbVar15[lVar23] & 0x3f) & 1) == 0))) {
        lVar23 = lVar23 + 1;
      }
      local_4c = 0;
      bVar5 = true;
      if (lVar23 == 0) break;
      pxVar11 = xmlStrndup(pbVar15,(int)lVar23);
      if (valNeeded == 0) {
        ppxVar16 = (xmlSchemaValPtr *)0x0;
      }
      else {
        ppxVar16 = &curVal;
      }
      uVar20 = local_70;
      iVar6 = xmlSchemaVCheckCVCSimpleType(actxt,node,local_40,pxVar11,ppxVar16,(int)local_70,0,1);
      local_60 = CONCAT44(extraout_var,iVar6);
      if (pxVar11 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar11);
      }
      uVar17 = local_60;
      if (curVal != (xmlSchemaValPtr)0x0) {
        if (val == (xmlSchemaValPtr)0x0) {
          val = curVal;
        }
        else {
          xmlSchemaValueAppend(local_38,curVal);
        }
        local_38 = curVal;
        curVal = (xmlSchemaValPtr)0x0;
      }
      iVar6 = (int)uVar20;
      length = length + 1;
      if ((int)uVar17 != 0) {
        if ((int)uVar17 < 0) {
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaVCheckCVCSimpleType","validating an item of list simple type",
                     (xmlChar *)0x0,(xmlChar *)ppxVar16);
          goto LAB_001acfc7;
        }
        local_4c = 0x721;
        bVar5 = false;
        break;
      }
      pbVar15 = pbVar15 + lVar23;
    } while (*pbVar15 != 0);
    pxVar14 = local_78;
    uVar17 = (ulong)local_4c;
    if ((bVar5) && (uVar17 = 0, (local_78->flags & 0x8000000) != 0)) {
      uVar17 = 0;
      pbVar15 = local_a0;
      pxVar21 = val;
      iVar7 = xmlSchemaValidateFacets
                        (actxt,node,local_78,XML_SCHEMAS_UNKNOWN,local_a0,val,length,(int)local_70);
      iVar6 = (int)pxVar21;
      if ((iVar7 == 0) || (uVar17 = 0x721, -1 < iVar7)) goto LAB_001acce6;
      xmlSchemaInternalErr2
                (actxt,"xmlSchemaVCheckCVCSimpleType","validating facets of list simple type",
                 (xmlChar *)0x0,pbVar15);
      local_60 = 0xffffffff;
LAB_001acfc7:
      bVar5 = false;
      pbVar15 = local_58;
      retVal = local_80;
    }
    else {
LAB_001acce6:
      retVal = local_80;
      bVar5 = true;
      pbVar15 = local_58;
      local_60 = uVar17;
      if (0 < (int)uVar17 && (int)local_70 != 0) {
        if (((char)local_48 != '\0') &&
           (pbVar15 = xmlSchemaNormalizeValue(pxVar14,local_a0), pbVar15 != (byte *)0x0)) {
          local_a0 = pbVar15;
        }
        xmlSchemaSimpleTypeErr(actxt,(xmlParserErrors)local_60,node,local_a0,pxVar14,iVar6);
      }
    }
    error = (xmlParserErrors)local_60;
    if (bVar5) {
LAB_001acea7:
      if (pbVar15 != (byte *)0x0) {
        (*xmlFree)(pbVar15);
      }
      if ((error == XML_ERR_OK) && (retVal != (xmlSchemaValPtr *)0x0)) {
        *retVal = val;
        return 0;
      }
      goto LAB_001acff9;
    }
  }
  if (pbVar15 != (byte *)0x0) {
    (*xmlFree)(pbVar15);
  }
  error = ~XML_ERR_OK;
LAB_001acff9:
  if (val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(val);
  }
  return error;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    TODO
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}